

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall TgBot::Api::deleteMessage(Api *this,int64_t chatId,int32_t messageId)

{
  initializer_list<TgBot::HttpReqArg> __l;
  HttpReqArg *local_308;
  allocator<TgBot::HttpReqArg> local_2ab;
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  HttpReqArg *local_1c0;
  HttpReqArg local_1b8;
  HttpReqArg local_130;
  iterator local_a8;
  size_type local_a0;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_98;
  allocator local_69;
  string local_68;
  ptree local_48;
  int32_t local_1c;
  int64_t iStack_18;
  int32_t messageId_local;
  int64_t chatId_local;
  Api *this_local;
  
  local_1c = messageId;
  iStack_18 = chatId;
  chatId_local = (int64_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"deleteMessage",&local_69);
  local_2aa = 1;
  local_1c0 = &local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"chat_id",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"text/plain",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"",&local_231);
  HttpReqArg::HttpReqArg<long>
            (&local_1b8,&local_1e0,&stack0xffffffffffffffe8,false,&local_208,&local_230);
  local_1c0 = &local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"message_id",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"text/plain",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"",&local_2a9);
  HttpReqArg::HttpReqArg<int>(&local_130,&local_258,&local_1c,false,&local_280,&local_2a8);
  local_2aa = 0;
  local_a8 = &local_1b8;
  local_a0 = 2;
  std::allocator<TgBot::HttpReqArg>::allocator(&local_2ab);
  __l._M_len = local_a0;
  __l._M_array = local_a8;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            (&local_98,__l,&local_2ab);
  sendRequest(&local_48,this,&local_68,&local_98);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_98);
  std::allocator<TgBot::HttpReqArg>::~allocator(&local_2ab);
  local_308 = (HttpReqArg *)&local_a8;
  do {
    local_308 = local_308 + -1;
    HttpReqArg::~HttpReqArg(local_308);
  } while (local_308 != &local_1b8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void Api::deleteMessage(int64_t chatId, int32_t messageId) const {
    sendRequest("deleteMessage", { HttpReqArg("chat_id", chatId), HttpReqArg("message_id", messageId) });
}